

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O1

Vector3 __thiscall pm::Sampler::sampleHemisphere(Sampler *this,unsigned_long *count,int *jump)

{
  Type TVar1;
  int iVar2;
  unsigned_long uVar3;
  uint32_t uVar4;
  ulong uVar5;
  int *in_RCX;
  float in_XMM1_Da;
  Vector3 VVar6;
  
  if (*(ulong *)jump % (ulong)*(uint *)((long)count + 0xc) == 0) {
    uVar4 = Random::integer((Random *)(count + 0xf),0,(uint32_t)count[2]);
    *in_RCX = uVar4 * *(int *)((long)count + 0xc);
  }
  iVar2 = *in_RCX;
  uVar5 = *(ulong *)jump;
  *(ulong *)jump = uVar5 + 1;
  uVar5 = (ulong)(uint)(*(int *)((uVar5 % (ulong)*(uint *)((long)count + 0xc)) * 4 + count[0xc] +
                                (long)iVar2 * 4) + iVar2);
  uVar3 = count[9];
  *(undefined4 *)&this->_vptr_Sampler = *(undefined4 *)(uVar3 + uVar5 * 0xc);
  *(undefined4 *)((long)&this->_vptr_Sampler + 4) = *(undefined4 *)(uVar3 + 4 + uVar5 * 0xc);
  TVar1 = *(Type *)(uVar3 + 8 + uVar5 * 0xc);
  VVar6.y = 0.0;
  VVar6.x = (float)TVar1;
  this->type_ = TVar1;
  VVar6.z = in_XMM1_Da;
  return VVar6;
}

Assistant:

Vector3 Sampler::sampleHemisphere(unsigned long &count, int &jump)
{
	// Start of a new pixel
	if (count % numSamples() == 0)
		jump = rnd_.integer(0, numSets_) * numSamples_;

	return hemisphereSamples_[jump + shuffledIndices_[jump + count++ % numSamples_]];
}